

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

ns_connection * ns_connect(ns_mgr *mgr,char *address,ns_callback_t callback,void *user_data)

{
  int sock;
  int iVar1;
  ns_connection *pnVar2;
  uint uVar3;
  int proto;
  int use_ssl;
  socket_address sa;
  char ca_cert [100];
  char cert [100];
  
  ns_parse_address(address,&sa,&proto,&use_ssl,cert,ca_cert);
  sock = socket(2,proto,0);
  if (sock == -1) {
    return (ns_connection *)0x0;
  }
  ns_set_non_blocking_mode(sock);
  if ((((proto == 2) || (iVar1 = connect(sock,(sockaddr *)&sa.sa,0x10), iVar1 == 0)) ||
      (iVar1 = ns_is_error(iVar1), iVar1 == 0)) &&
     (pnVar2 = ns_add_sock(mgr,sock,callback,user_data), pnVar2 != (ns_connection *)0x0)) {
    *(undefined8 *)&pnVar2->sa = sa._0_8_;
    *(uchar (*) [8])((long)&pnVar2->sa + 8) = sa.sin.sin_zero;
    uVar3 = 8;
    if (proto == 2) {
      uVar3 = 0x100;
    }
    pnVar2->flags = uVar3;
    return pnVar2;
  }
  close(sock);
  return (ns_connection *)0x0;
}

Assistant:

struct ns_connection *ns_connect(struct ns_mgr *mgr, const char *address,
                                 ns_callback_t callback, void *user_data) {
  sock_t sock = INVALID_SOCKET;
  struct ns_connection *nc = NULL;
  union socket_address sa;
  char cert[100], ca_cert[100];
  int rc, use_ssl, proto;

  ns_parse_address(address, &sa, &proto, &use_ssl, cert, ca_cert);
  if ((sock = socket(AF_INET, proto, 0)) == INVALID_SOCKET) {
    return NULL;
  }
  ns_set_non_blocking_mode(sock);
  rc = (proto == SOCK_DGRAM) ? 0 : connect(sock, &sa.sa, sizeof(sa.sin));

  if (rc != 0 && ns_is_error(rc)) {
    closesocket(sock);
    return NULL;
  } else if ((nc = ns_add_sock(mgr, sock, callback, user_data)) == NULL) {
    closesocket(sock);
    return NULL;
  }

  nc->sa = sa;   // Important, cause UDP conns will use sendto()
  nc->flags = (proto == SOCK_DGRAM) ? NSF_UDP : NSF_CONNECTING;

#ifdef NS_ENABLE_SSL
  if (use_ssl) {
    if ((nc->ssl_ctx = SSL_CTX_new(SSLv23_client_method())) == NULL ||
        ns_use_cert(nc->ssl_ctx, cert) != 0 ||
        ns_use_ca_cert(nc->ssl_ctx, ca_cert) != 0 ||
        (nc->ssl = SSL_new(nc->ssl_ctx)) == NULL) {
      ns_close_conn(nc);
      return NULL;
    } else {
      SSL_set_fd(nc->ssl, sock);
    }
  }
#endif

  return nc;
}